

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
ot::commissioner::Interpreter::PrintNetworkMessage
          (Interpreter *this,uint64_t aNid,string *aMessage,Color aColor)

{
  string local_98;
  string local_68;
  undefined1 local_48 [8];
  string nidHex;
  Color aColor_local;
  string *aMessage_local;
  uint64_t aNid_local;
  Interpreter *this_local;
  
  nidHex.field_2._12_4_ = aColor;
  utils::Hex<unsigned_long>((string *)local_48,aNid);
  std::__cxx11::string::string((string *)&local_68,(string *)local_48);
  std::__cxx11::string::string((string *)&local_98,(string *)aMessage);
  PrintNetworkMessage(this,&local_68,&local_98,nidHex.field_2._12_4_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Interpreter::PrintNetworkMessage(uint64_t aNid, std::string aMessage, Console::Color aColor)
{
    std::string nidHex = utils::Hex(aNid);
    PrintNetworkMessage(nidHex, aMessage, aColor);
}